

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_cbor_tests.cpp
# Opt level: O2

void check_encode_cbor(vector<unsigned_char,_std::allocator<unsigned_char>_> *expected,json *j)

{
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  ulong uVar2;
  SourceLineInfo local_108;
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  StringRef local_d8;
  BinaryExpr<const_unsigned_long_&,_const_unsigned_long_&> local_c8;
  unsigned_long local_98;
  long local_90;
  AssertionHandler catchAssertionHandler;
  StringRef local_40;
  
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  catchAssertionHandler.m_assertionInfo.lineInfo.line._0_4_ = 0x400;
  catchAssertionHandler.m_assertionInfo.macroName.m_start =
       jsoncons::cbor::cbor_encode_options::vtable + 0x18;
  catchAssertionHandler.m_assertionInfo.lineInfo.file =
       jsoncons::cbor::cbor_encode_options::vtable + 0x40;
  catchAssertionHandler.m_assertionInfo.macroName.m_size._0_2_ = 0;
  jsoncons::cbor::
  encode_cbor<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (j,&result,(cbor_encode_options *)&catchAssertionHandler);
  if ((long)result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start !=
      (long)(expected->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(expected->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start) {
    pbVar1 = jsoncons::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,j);
    std::operator<<((ostream *)pbVar1,"\n");
  }
  local_c8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x65aae6;
  local_c8.super_ITransientExpression.m_isBinaryExpression = true;
  local_c8.super_ITransientExpression.m_result = false;
  local_c8.super_ITransientExpression._10_6_ = 0;
  local_108.file =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/cbor/src/encode_cbor_tests.cpp"
  ;
  local_108.line = 0x1b;
  Catch::StringRef::StringRef(&local_40,"result.size() == expected.size()");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_c8,&local_108,local_40,Normal);
  local_90 = (long)result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  local_108.file = (char *)&local_90;
  local_98 = (long)(expected->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(expected->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
  Catch::ExprLhs<unsigned_long_const&>::operator==
            (&local_c8,(ExprLhs<unsigned_long_const&> *)&local_108,&local_98);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_c8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_c8.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  for (uVar2 = 0;
      uVar2 < (ulong)((long)(expected->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(expected->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start); uVar2 = uVar2 + 1) {
    local_c8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x65aae6;
    local_c8.super_ITransientExpression.m_isBinaryExpression = true;
    local_c8.super_ITransientExpression.m_result = false;
    local_c8.super_ITransientExpression._10_6_ = 0;
    local_108.file =
         "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/cbor/src/encode_cbor_tests.cpp"
    ;
    local_108.line = 0x1e;
    Catch::StringRef::StringRef(&local_d8,"result[i] == expected[i]");
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_c8,&local_108,local_d8,Normal);
    local_108.file =
         (char *)(result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start + uVar2);
    Catch::ExprLhs<unsigned_char_const&>::operator==
              ((BinaryExpr<const_unsigned_char_&,_const_unsigned_char_&> *)&local_c8,
               (ExprLhs<unsigned_char_const&> *)&local_108,
               (expected->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
               .super__Vector_impl_data._M_start + uVar2);
    Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_c8.super_ITransientExpression)
    ;
    Catch::ITransientExpression::~ITransientExpression(&local_c8.super_ITransientExpression);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

void check_encode_cbor(const std::vector<uint8_t>& expected, const json& j)
{
    std::vector<uint8_t> result;
    cbor::encode_cbor(j,result);

    if (result.size() != expected.size())
    {
        std::cout << j << "\n";
    }
    REQUIRE(result.size() == expected.size());
    for (std::size_t i = 0; i < expected.size(); ++i)
    {
        REQUIRE(result[i] == expected[i]);
    }
}